

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::translatePrint(Builder *this,FuncCallExpr *print)

{
  BuilderContext *id;
  shared_ptr<mocker::ast::FuncCallExpr> *psVar1;
  bool bVar2;
  bool bVar3;
  __shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  reference pvVar5;
  char *pcVar6;
  initializer_list<std::shared_ptr<mocker::ast::Expression>_> __l;
  initializer_list<std::shared_ptr<mocker::ast::Expression>_> __l_00;
  allocator_type local_b9;
  shared_ptr<mocker::ir::Addr> arg;
  shared_ptr<mocker::ast::FuncCallExpr> toString;
  shared_ptr<mocker::ast::FuncCallExpr> printRhs;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<mocker::ast::FuncCallExpr> printLhs;
  value_type val;
  
  p_Var4 = &std::
            vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ::at(&print->args,0)->
            super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&val.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
  bVar2 = std::operator==(&((print->identifier).
                            super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->val,"println");
  std::dynamic_pointer_cast<mocker::ast::FuncCallExpr,mocker::ast::Expression>
            ((shared_ptr<mocker::ast::Expression> *)&toString);
  if ((toString.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     (bVar3 = std::operator!=(&(((toString.
                                  super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->identifier).
                                super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->val,"toString"), bVar3)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&toString.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::dynamic_pointer_cast<mocker::ast::BinaryExpr,mocker::ast::Expression>
              ((shared_ptr<mocker::ast::Expression> *)&arg);
    if ((arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
         (element_type *)0x0) ||
       (*(int *)&arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[3].
                 _vptr_Addr != 0xe)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      translateCall(this,print);
      goto LAB_00138982;
    }
    local_70._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::make_shared<mocker::ast::Identifier,char_const(&)[6]>((char (*) [6])&printRhs);
    std::__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *)
               (arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4));
    __l._M_len = 1;
    __l._M_array = (iterator)local_80;
    std::
    vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ::vector((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
              *)&toString,__l,(allocator_type *)local_70);
    std::
    make_shared<mocker::ast::FuncCallExpr,decltype(nullptr),std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
              ((void **)&printLhs,(shared_ptr<mocker::ast::Identifier> *)(local_70 + 8),
               (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                *)&printRhs);
    std::
    vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ::~vector((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
               *)&toString);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&printRhs.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    translatePrint(this,printLhs.
                        super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    local_70._0_8_ = (element_type *)0x0;
    std::make_shared<mocker::ast::Identifier,char_const*>((char **)local_80);
    std::__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),
               (__shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2> *)
               (arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 6));
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)(local_70 + 8);
    std::
    vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ::vector((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
              *)&toString,__l_00,&local_b9);
    std::
    make_shared<mocker::ast::FuncCallExpr,decltype(nullptr),std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
              ((void **)&printRhs,(shared_ptr<mocker::ast::Identifier> *)local_70,
               (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                *)local_80);
    std::
    vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ::~vector((vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
               *)&toString);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    translatePrint(this,printRhs.
                        super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&printRhs.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&printLhs.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    psVar1 = (shared_ptr<mocker::ast::FuncCallExpr> *)&arg;
  }
  else {
    pvVar5 = std::
             vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
             ::at(&(toString.
                    super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->args,0);
    (*(((pvVar5->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      super_ASTNode)._vptr_ASTNode[3])();
    id = this->ctx;
    std::
    vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
    ::at(&(toString.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->args,0);
    BuilderContext::getExprAddr((BuilderContext *)&arg,(NodeID)id);
    pcVar6 = "_printInt";
    if (bVar2) {
      pcVar6 = "_printlnInt";
    }
    printLhs.super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pcVar6;
    BuilderContext::emplaceInst<mocker::ir::Call,char_const*,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,(char **)&printLhs,&arg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar1 = &toString;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->super___shared_ptr<mocker::ast::FuncCallExpr,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
LAB_00138982:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&val.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Builder::translatePrint(const ast::FuncCallExpr &print) const {
  auto val = print.args.at(0);
  bool newline = (print.identifier->val == "println");

  // can be converted to printInt ?
  while (true) {
    auto toString = std::dynamic_pointer_cast<ast::FuncCallExpr>(val);
    if (!toString || toString->identifier->val != "toString")
      break;
    visit(*toString->args.at(0));
    auto arg = ctx.getExprAddr(toString->args.at(0)->getID());
    ctx.emplaceInst<Call>(newline ? "_printlnInt" : "_printInt", arg);
    return;
  }

  // can be split into two print's ?
  while (true) {
    auto concat = std::dynamic_pointer_cast<ast::BinaryExpr>(val);
    if (!concat || concat->op != ast::BinaryExpr::Add)
      break;
    auto printLhs = std::make_shared<ast::FuncCallExpr>(
        nullptr, std::make_shared<ast::Identifier>("print"),
        std::vector<std::shared_ptr<ast::Expression>>{concat->lhs});
    translatePrint(*printLhs);
    auto printRhs = std::make_shared<ast::FuncCallExpr>(
        nullptr,
        std::make_shared<ast::Identifier>(newline ? "println" : "print"),
        std::vector<std::shared_ptr<ast::Expression>>{concat->rhs});
    translatePrint(*printRhs);
    return;
  }

  translateCall(print);
}